

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandNumGen.cpp
# Opt level: O0

void __thiscall OpenMD::Utils::RandNumGen::RandNumGen(RandNumGen *this,result_type seed)

{
  size_type __n;
  reference pvVar1;
  void *in_RDI;
  seed_seq seq;
  vector<unsigned_long,_std::allocator<unsigned_long>_> initalSequence;
  vector<unsigned_long,_std::allocator<unsigned_long>_> seeds;
  result_type result;
  int nProcessors;
  int worldRank;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffeb78;
  unsigned_long in_stack_ffffffffffffeb80;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffeb88;
  allocator_type *in_stack_ffffffffffffeb90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  size_type in_stack_ffffffffffffeb98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffeba0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  undefined1 local_1440 [16];
  seed_seq *in_stack_ffffffffffffebd0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffebd8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffebe0;
  seed_seq *in_stack_ffffffffffffed20;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffed28;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffed30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_69 [2];
  value_type local_20;
  int local_18;
  int local_14;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1c5519);
  local_14 = 0;
  local_18 = 1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1c554e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1c5574);
  __n = (size_type)local_18;
  this_01 = local_69;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1c5593);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_01,__n,in_stack_ffffffffffffeb90);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1c55b9);
  __first._M_current =
       (unsigned_long *)
       ((long)&local_69[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_start + 1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffeb78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffeb78);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            (__first,in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffeb78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffeb78);
  std::seed_seq::
  seed_seq<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
  this_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)&stack0xffffffffffffffc8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffeb78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffeb78);
  std::seed_seq::
  generate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_ffffffffffffed20,in_stack_ffffffffffffed30,in_stack_ffffffffffffed28);
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &stack0xffffffffffffffc8,(long)local_14);
  local_20 = *pvVar1;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this_00,(result_type_conflict)in_stack_ffffffffffffeb78);
  memcpy(in_RDI,local_1440,5000);
  std::seed_seq::~seed_seq((seed_seq *)0x1c56ef);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__first._M_current);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)__first._M_current);
  return;
}

Assistant:

RandNumGen::RandNumGen(result_type seed) {
    int worldRank {};
    int nProcessors {1};

#ifdef IS_MPI
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    MPI_Comm_size(MPI_COMM_WORLD, &nProcessors);
#endif
    result_type result;
    std::vector<result_type> seeds(nProcessors);

#ifdef IS_MPI
    if (worldRank == 0) {
#endif
      std::vector<result_type> initalSequence(nProcessors);
      std::iota(initalSequence.begin(), initalSequence.end(), seed);

      // Generate the seed_seq to initialize the RNG on each processor
      std::seed_seq seq(initalSequence.begin(), initalSequence.end());

      seq.generate(seeds.begin(), seeds.end());
#ifdef IS_MPI
    }

    MPI_Bcast(&seeds[0], nProcessors, MPI_UINT32_T, 0, MPI_COMM_WORLD);
#endif
    result = seeds[worldRank];

    engine = std::mt19937(result);
  }